

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphGenerator.cpp
# Opt level: O0

void __thiscall GraphGenerator::output(GraphGenerator *this,int n)

{
  int iVar1;
  char *__filename;
  FILE *__stream;
  size_type sVar2;
  reference pvVar3;
  int local_24;
  int i;
  FILE *out;
  int n_local;
  GraphGenerator *this_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"w");
  sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    (&this->edges);
  fprintf(__stream,"p edge %d %d\n",(ulong)(uint)n,sVar2 & 0xffffffff);
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                      (&this->edges);
    if (sVar2 <= (ulong)(long)local_24) break;
    pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (&this->edges,(long)local_24);
    iVar1 = pvVar3->first;
    pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (&this->edges,(long)local_24);
    fprintf(__stream,"e %d %d\n",(ulong)(iVar1 + 1),(ulong)(pvVar3->second + 1));
    local_24 = local_24 + 1;
  }
  fclose(__stream);
  return;
}

Assistant:

void GraphGenerator::output(int n) {
	FILE *out = fopen(fileName.c_str(), "w");
	fprintf(out, "p edge %d %d\n", n, (int)edges.size());
	for (int i = 0; i < edges.size(); i++) {
		fprintf(out, "e %d %d\n", edges[i].first + 1, edges[i].second + 1);
	}
	fclose(out);
}